

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::LabelInstr::Dump(LabelInstr *this,IRDumpFlags flags)

{
  bool bVar1;
  ProfiledLabelInstr *pPVar2;
  IRDumpFlags flags_local;
  LabelInstr *this_local;
  
  if (this->m_block != (BasicBlock *)0x0) {
    BasicBlock::DumpHeader(this->m_block,true);
  }
  if (this->m_name == (char16 *)0x0) {
    Output::Print(L"$L%d:",(ulong)this->m_id);
  }
  else {
    Output::Print(L"$L%d (%s):",(ulong)this->m_id,this->m_name);
  }
  if (((byte)this->field_0x78 >> 1 & 1) != 0) {
    Output::Print(L" [helper]");
  }
  if ((this->field_0x78 & 1) != 0) {
    Output::Print(L" >>>>>>>>>>>>>  LOOP TOP  >>>>>>>>>>>>>");
  }
  bVar1 = Instr::IsProfiledLabelInstr(&this->super_Instr);
  if (bVar1) {
    Output::SkipToColumn(0x32);
    pPVar2 = Instr::AsProfiledLabelInstr(&this->super_Instr);
    if (pPVar2->loopImplicitCallFlags == ImplicitCall_HasNoInfo) {
      Output::Print(L"Implicit call: ???");
    }
    else if (pPVar2->loopImplicitCallFlags == ImplicitCall_None) {
      Output::Print(L"Implicit call: no");
    }
    else {
      Output::Print(L"Implicit call: yes");
    }
  }
  if ((flags & (IRDumpFlags_SkipByteCodeOffset|IRDumpFlags_AsmDumpMode)) == IRDumpFlags_None) {
    Instr::DumpByteCodeOffset(&this->super_Instr);
  }
  Output::Print(L"\n");
  return;
}

Assistant:

void
LabelInstr::Dump(IRDumpFlags flags)
{
    if (this->m_block != NULL)
    {
        this->m_block->DumpHeader();
    }
#if DBG
    if (this->m_name != nullptr)
    {
        Output::Print(_u("$L%d (%s):"), this->m_id, this->m_name);
    }
    else
#endif
    {
        Output::Print(_u("$L%d:"), this->m_id);
    }
    if (this->isOpHelper)
    {
        Output::Print(_u(" [helper]"));
    }
    if (this->m_isLoopTop)
    {
        Output::Print(_u(" >>>>>>>>>>>>>  LOOP TOP  >>>>>>>>>>>>>"));
    }
    if (this->IsProfiledLabelInstr())
    {
        Output::SkipToColumn(50);
        switch (this->AsProfiledLabelInstr()->loopImplicitCallFlags)
        {
        case Js::ImplicitCall_HasNoInfo:
            Output::Print(_u("Implicit call: ???"));
            break;
        case Js::ImplicitCall_None:
            Output::Print(_u("Implicit call: no"));
            break;
        default:
            Output::Print(_u("Implicit call: yes"));
            break;
        }
    }
    if ((flags & (IRDumpFlags_AsmDumpMode | IRDumpFlags_SkipByteCodeOffset)) == 0)
    {
        this->DumpByteCodeOffset();
    }
    Output::Print(_u("\n"));
}